

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  st_iterator *it;
  st_iterator *this_01;
  st_iterator *it_00;
  int iVar1;
  long lVar2;
  long lVar3;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  *ppVar4;
  Table *pTVar5;
  AssertionResult *pAVar6;
  undefined8 *puVar7;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  *ppVar8;
  const_iterator *pcVar9;
  iterator *piVar10;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *ppVar11;
  const_iterator *pcVar12;
  char *pcVar13;
  char *in_R9;
  bool bVar14;
  byte bVar15;
  AssertHelper local_3d0;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_;
  undefined8 local_318 [10];
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_2c8;
  TypeParam ht;
  AssertionResult gtest_ar__1;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  iterator local_88;
  
  bVar15 = 0;
  eq_pair.first.super_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.first.super_iterator.end.col_current = (nonempty_iterator)0x0;
  eq_pair.first.super_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.first.super_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.first.super_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.first.super_iterator.pos.col_current = (nonempty_iterator)0x0;
  eq_pair.first.parent_ =
       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        *)0x0;
  eq_pair.first.super_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.first.super_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.second.super_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.second.super_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.second.super_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.second.super_iterator.pos.col_current = (nonempty_iterator)0x0;
  eq_pair.second.super_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.second.super_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.second.super_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  eq_pair.second.super_iterator.end.col_current = (nonempty_iterator)0x0;
  eq_pair.second.parent_ =
       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        *)0x0;
  const_eq_pair.first.super_const_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.first.super_const_iterator.end.col_current = (const_nonempty_iterator)0x0;
  const_eq_pair.first.super_const_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.first.super_const_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.first.super_const_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.first.super_const_iterator.pos.col_current = (const_nonempty_iterator)0x0;
  const_eq_pair.first.super_const_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.first.super_const_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.first.parent_ =
       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        *)0x0;
  const_eq_pair.second.super_const_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.second.super_const_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.second.super_const_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.second.super_const_iterator.pos.col_current = (const_nonempty_iterator)0x0;
  const_eq_pair.second.parent_ =
       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        *)0x0;
  const_eq_pair.second.super_const_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.second.super_const_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.second.super_const_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  const_eq_pair.second.super_const_iterator.end.col_current = (const_nonempty_iterator)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar14 = (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.table.settings.num_buckets ==
           (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.num_deleted;
  gtest_ar_.success_ = bVar14;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ht,(internal *)&gtest_ar_,(AssertionResult *)"this->ht_.empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ae,(char *)CONCAT44(ht.
                                       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._4_4_,
                                       (int)ht.
                                            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                            ._vptr_BaseHashtableInterface));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5,(Message *)&gtest_ar__1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
    std::__cxx11::string::~string((string *)&ht);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&ht,
         &this_00->
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&gtest_ar__5);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((iterator *)&gtest_ar_,
        &this_00->
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&ht.
                            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            .ht_,(iterator *)&gtest_ar_.message_);
  gtest_ar__1.success_ = bVar14;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ht,(internal *)&gtest_ar__1,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) == this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2af,(char *)CONCAT44(ht.
                                       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._4_4_,
                                       (int)ht.
                                            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                            ._vptr_BaseHashtableInterface));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
    std::__cxx11::string::~string((string *)&ht);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar__1.success_ = false;
  gtest_ar__1._1_3_ = 0;
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar__5._0_4_ = -iVar1;
  local_2c8 = &(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_;
  gtest_ar_._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(local_2c8,(int *)&gtest_ar__5);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&ht,"0u","this->ht_.count(this->UniqueKey(1))",(uint *)&gtest_ar__1,
             (unsigned_long *)&gtest_ar_);
  if ((char)ht.
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ._vptr_BaseHashtableInterface == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (ht.
        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher._0_8_
        == 0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)ht.
                          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                          super_Hasher._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b0,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  it = &eq_pair.second.super_iterator.pos;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ht.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_);
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar_._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
                 *)&ht,&this_00->
                        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar_);
  lVar3 = 10;
  ppVar4 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
            *)&ht;
  ppVar8 = &eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar8->first).super_iterator.ht = (ppVar4->first).super_iterator.ht;
    ppVar4 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)((long)ppVar4 + (ulong)bVar15 * -0x10 + 8);
    ppVar8 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)((long)ppVar8 + (ulong)bVar15 * -0x10 + 8);
  }
  pTVar5 = &ht.
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.table;
  piVar10 = &eq_pair.second;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (piVar10->super_iterator).ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)&(pTVar5->groups).
               super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
               ._M_impl.super__Tp_alloc_type;
    pTVar5 = (Table *)((long)pTVar5 + (ulong)bVar15 * -0x10 + 8);
    piVar10 = (iterator *)((long)piVar10 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(&eq_pair.first.super_iterator.pos,it);
  gtest_ar_.success_ = bVar14;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ht,(internal *)&gtest_ar_,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b2,(char *)CONCAT44(ht.
                                       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._4_4_,
                                       (int)ht.
                                            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                            ._vptr_BaseHashtableInterface));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5,(Message *)&gtest_ar__1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
    std::__cxx11::string::~string((string *)&ht);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar_._0_4_ = iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar14 = (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.table.settings.num_buckets !=
           (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.num_deleted;
  gtest_ar_.success_ = bVar14;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ht,(internal *)&gtest_ar_,(AssertionResult *)"this->ht_.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b5,(char *)CONCAT44(ht.
                                       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._4_4_,
                                       (int)ht.
                                            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                            ._vptr_BaseHashtableInterface));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5,(Message *)&gtest_ar__1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
    std::__cxx11::string::~string((string *)&ht);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(0xb);
  gtest_ar_._0_4_ = iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_4_ = UniqueObjectHelper<int>(0x6f);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_4_ = UniqueObjectHelper<int>(0x457);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_4_ = UniqueObjectHelper<int>(0x1b207);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_4_ = UniqueObjectHelper<int>(0x10f447);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_4_ = UniqueObjectHelper<int>(0xa98ac7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_4_ = UniqueObjectHelper<int>(0x69f6bc7);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&ht,&this_00->
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar__1.success_ = true;
  gtest_ar__1._1_3_ = 0;
  gtest_ar_._0_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.settings.num_buckets -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&ht,"9u","this->ht_.size()",(uint *)&gtest_ar__1,
             (unsigned_long *)&gtest_ar_);
  if ((char)ht.
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ._vptr_BaseHashtableInterface == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (ht.
        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher._0_8_
        == 0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)ht.
                          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                          super_Hasher._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2be,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ht.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_);
  iVar1 = UniqueObjectHelper<int>(1);
  ht.
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(&local_88,
         &this_00->
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&ht);
  gtest_ar__1.success_ = local_88.super_iterator.ht._0_1_;
  gtest_ar__1._1_3_ = local_88.super_iterator.ht._1_3_;
  gtest_ar__1._4_4_ = local_88.super_iterator.ht._4_4_;
  iVar1 = (*(local_88.parent_)->_vptr_BaseHashtableInterface[0xb])();
  gtest_ar_._0_4_ = iVar1;
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar__5._0_4_ = -iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&ht,"it.key()","this->UniqueKey(1)",(int *)&gtest_ar_,(int *)&gtest_ar__5);
  if ((char)ht.
            super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ._vptr_BaseHashtableInterface == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (ht.
        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher._0_8_
        == 0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)ht.
                          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                          super_Hasher._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c0,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ht.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable(&ht,this_00);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&gtest_ar_,
         &this_00->
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((iterator *)&gtest_ar__5,
        &this_00->
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) != this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c6,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = true;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(local_2c8,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"1u","this->ht_.count(this->UniqueKey(1))",(uint *)&gtest_ar__4,
             (unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c7,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
                 *)&gtest_ar_,
                &this_00->
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar4 = &eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar4->first).super_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar4 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)((long)ppVar4 + (ulong)bVar15 * -0x10 + 8);
  }
  puVar7 = local_318;
  piVar10 = &eq_pair.second;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (piVar10->super_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    piVar10 = (iterator *)((long)piVar10 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=(&eq_pair.first.super_iterator.pos,it);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c9,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  iVar1 = (*(eq_pair.first.parent_)->_vptr_BaseHashtableInterface[10])();
  gtest_ar__5._0_4_ = iVar1;
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar__4._0_4_ = -iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"eq_pair.first.key()","this->UniqueKey(1)",(int *)&gtest_ar__5,
             (int *)&gtest_ar__4);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ca,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)&eq_pair);
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(&eq_pair.first.super_iterator.pos,it);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cc,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((const_iterator *)&gtest_ar_,
         &ht.
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((const_iterator *)&gtest_ar__5,
        &ht.
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"ht.find(this->UniqueKey(1)) != ht.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ce,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = true;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(&ht.
                     super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     .ht_,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"1u","ht.count(this->UniqueKey(1))",(uint *)&gtest_ar__4,
             (unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cf,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
                 *)&gtest_ar_,
                &ht.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  this_01 = &const_eq_pair.first.super_const_iterator.pos;
  it_00 = &const_eq_pair.second.super_const_iterator.pos;
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar11 = &const_eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar11->first).super_const_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar11 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)((long)ppVar11 + (ulong)bVar15 * -0x10 + 8);
  }
  pcVar12 = &const_eq_pair.second;
  puVar7 = local_318;
  pcVar9 = pcVar12;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pcVar9->super_const_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    pcVar9 = (const_iterator *)((long)pcVar9 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=(this_01,it_00);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d1,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  iVar1 = (*(const_eq_pair.first.parent_)->_vptr_BaseHashtableInterface[0xb])();
  gtest_ar__5._0_4_ = iVar1;
  iVar1 = UniqueObjectHelper<int>(1);
  gtest_ar__4._0_4_ = -iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"const_eq_pair.first.key()","this->UniqueKey(1)",
             (int *)&gtest_ar__5,(int *)&gtest_ar__4);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d2,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)&const_eq_pair);
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(this_01,it_00);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d4,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&gtest_ar_,
         &this_00->
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((iterator *)&gtest_ar__5,
        &this_00->
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11111)) != this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d6,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = true;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(local_2c8,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"1u","this->ht_.count(this->UniqueKey(11111))",
             (uint *)&gtest_ar__4,(unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d7,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(0x2b67);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
                 *)&gtest_ar_,
                &this_00->
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar4 = &eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar4->first).super_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar4 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)((long)ppVar4 + (ulong)bVar15 * -0x10 + 8);
  }
  puVar7 = local_318;
  piVar10 = &eq_pair.second;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (piVar10->super_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    piVar10 = (iterator *)((long)piVar10 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=(&eq_pair.first.super_iterator.pos,it);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d9,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  iVar1 = (*(eq_pair.first.parent_)->_vptr_BaseHashtableInterface[10])();
  gtest_ar__5._0_4_ = iVar1;
  iVar1 = UniqueObjectHelper<int>(0x2b67);
  gtest_ar__4._0_4_ = -iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"eq_pair.first.key()","this->UniqueKey(11111)",
             (int *)&gtest_ar__5,(int *)&gtest_ar__4);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2da,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  google::
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)&eq_pair);
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(&eq_pair.first.super_iterator.pos,it);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2dc,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((const_iterator *)&gtest_ar_,
         &ht.
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((const_iterator *)&gtest_ar__5,
        &ht.
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"ht.find(this->UniqueKey(11111)) != ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2de,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = true;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b67);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(&ht.
                     super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     .ht_,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"1u","ht.count(this->UniqueKey(11111))",(uint *)&gtest_ar__4,
             (unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2df,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(0x2b67);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
                 *)&gtest_ar_,
                &ht.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar11 = &const_eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar11->first).super_const_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar11 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)((long)ppVar11 + (ulong)bVar15 * -0x10 + 8);
  }
  puVar7 = local_318;
  pcVar9 = pcVar12;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pcVar9->super_const_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    pcVar9 = (const_iterator *)((long)pcVar9 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=(this_01,it_00);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e1,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  iVar1 = (*(const_eq_pair.first.parent_)->_vptr_BaseHashtableInterface[0xb])();
  gtest_ar__5._0_4_ = iVar1;
  iVar1 = UniqueObjectHelper<int>(0x2b67);
  gtest_ar__4._0_4_ = -iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"const_eq_pair.first.key()","this->UniqueKey(11111)",
             (int *)&gtest_ar__5,(int *)&gtest_ar__4);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e2,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)&const_eq_pair);
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(this_01,it_00);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e4,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&gtest_ar_,
         &this_00->
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((iterator *)&gtest_ar__5,
        &this_00->
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11112)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e7,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(local_2c8,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"0u","this->ht_.count(this->UniqueKey(11112))",
             (uint *)&gtest_ar__4,(unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e8,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(0x2b68);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
                 *)&gtest_ar_,
                &this_00->
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar4 = &eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar4->first).super_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar4 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)((long)ppVar4 + (ulong)bVar15 * -0x10 + 8);
  }
  puVar7 = local_318;
  piVar10 = &eq_pair.second;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (piVar10->super_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    piVar10 = (iterator *)((long)piVar10 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(&eq_pair.first.super_iterator.pos,it);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ea,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((const_iterator *)&gtest_ar_,
         &ht.
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((const_iterator *)&gtest_ar__5,
        &ht.
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"ht.find(this->UniqueKey(11112)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ec,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b68);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(&ht.
                     super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     .ht_,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"0u","ht.count(this->UniqueKey(11112))",(uint *)&gtest_ar__4,
             (unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ed,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(0x2b68);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
                 *)&gtest_ar_,
                &ht.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar11 = &const_eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar11->first).super_const_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar11 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)((long)ppVar11 + (ulong)bVar15 * -0x10 + 8);
  }
  puVar7 = local_318;
  pcVar9 = pcVar12;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pcVar9->super_const_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    pcVar9 = (const_iterator *)((long)pcVar9 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(this_01,it_00);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ef,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&gtest_ar_,
         &this_00->
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((iterator *)&gtest_ar__5,
        &this_00->
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11110)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f1,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(local_2c8,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"0u","this->ht_.count(this->UniqueKey(11110))",
             (uint *)&gtest_ar__4,(unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f2,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(0x2b66);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
                 *)&gtest_ar_,
                &this_00->
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar4 = &eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar4->first).super_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar4 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)((long)ppVar4 + (ulong)bVar15 * -0x10 + 8);
  }
  puVar7 = local_318;
  piVar10 = &eq_pair.second;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (piVar10->super_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    piVar10 = (iterator *)((long)piVar10 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(&eq_pair.first.super_iterator.pos,it);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f4,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((const_iterator *)&gtest_ar_,
         &ht.
          super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ,(key_type *)&local_3d0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((const_iterator *)&gtest_ar__5,
        &ht.
         super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       );
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)&gtest_ar_.message_,(iterator *)&gtest_ar__5.message_);
  gtest_ar__4.success_ = bVar14;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"ht.find(this->UniqueKey(11110)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f6,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__5);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_3_ = 0;
  local_3d0.data_._0_4_ = UniqueObjectHelper<int>(0x2b66);
  local_3d0.data_._0_4_ = -(int)local_3d0.data_;
  gtest_ar__5._0_8_ =
       google::
       sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(&ht.
                     super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     .ht_,(int *)&local_3d0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_,"0u","ht.count(this->UniqueKey(11110))",(uint *)&gtest_ar__4,
             (unsigned_long *)&gtest_ar__5);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__5);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f7,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__5)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    if (gtest_ar__5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = UniqueObjectHelper<int>(0x2b66);
  gtest_ar__5._0_4_ = -iVar1;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
                 *)&gtest_ar_,
                &ht.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ,(key_type *)&gtest_ar__5);
  lVar3 = 10;
  pAVar6 = &gtest_ar_;
  ppVar11 = &const_eq_pair;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (ppVar11->first).super_const_iterator.ht =
         *(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           **)pAVar6;
    pAVar6 = (AssertionResult *)&pAVar6[-(ulong)bVar15].message_;
    ppVar11 = (pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)((long)ppVar11 + (ulong)bVar15 * -0x10 + 8);
  }
  puVar7 = local_318;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pcVar12->super_const_iterator).ht =
         (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar15 * -2 + 1;
    pcVar12 = (const_iterator *)((long)pcVar12 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar14 = google::
           const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==(this_01,it_00);
  gtest_ar__5.success_ = bVar14;
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar14) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__5,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f9,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__5.message_);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface
            (&ht.
              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            );
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}